

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::Incomplete2DSizeCase::createTexture(Incomplete2DSizeCase *this)

{
  uint uVar1;
  int height;
  TextureFormat TVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  GLenum err;
  MessageBuilder *this_00;
  uint uVar6;
  GLsizei height_00;
  int iVar7;
  int width;
  int width_00;
  int level;
  long lVar8;
  GLuint texture;
  TextureFormat local_200;
  Vec4 local_1f8;
  TextureFormat fmt;
  TextureLevel levelData;
  undefined1 local_1b0 [384];
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  TVar2 = (TextureFormat)((this->super_Tex2DCompletenessCase).m_testCtx)->m_log;
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  uVar1 = (this->m_size).m_data[0];
  uVar5 = 0x20;
  uVar6 = uVar5;
  if (uVar1 != 0) {
    uVar6 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  uVar1 = (this->m_size).m_data[1];
  if (uVar1 != 0) {
    uVar5 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  iVar7 = 0x1f - uVar5;
  if ((int)(0x1f - uVar5) < (int)(0x1f - uVar6)) {
    iVar7 = 0x1f - uVar6;
  }
  local_200 = TVar2;
  for (level = 0; iVar7 + 1 != level; level = level + 1) {
    height = (this->m_size).m_data[1];
    if (level == *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
      width_00 = (this->m_invalidLevelSize).m_data[0];
      width = (this->m_size).m_data[0];
      height_00 = (this->m_invalidLevelSize).m_data[1];
    }
    else {
      width = (this->m_size).m_data[0];
      width_00 = width >> ((byte)level & 0x1f);
      if (width_00 < 2) {
        width_00 = 1;
      }
      height_00 = height >> ((byte)level & 0x1f);
      if (height_00 < 2) {
        height_00 = 1;
      }
    }
    tcu::TextureLevel::setSize(&levelData,width,height,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
    local_1f8.m_data[0] = 0.0;
    local_1f8.m_data[1] = 0.0;
    local_1f8.m_data[2] = 1.0;
    local_1f8.m_data[3] = 1.0;
    tcu::clear((PixelBufferAccess *)local_1b0,&local_1f8);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
    glwTexImage2D(0xde1,level,0x1908,width_00,height_00,0,0x1908,0x1401,(void *)local_1b0._32_8_);
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x127);
  uVar1 = (this->m_size).m_data[0];
  if (((uVar1 & uVar1 - 1) != 0) && (uVar1 = (this->m_size).m_data[1], (uVar1 & uVar1 - 1) != 0)) {
    lVar3 = 0;
    do {
      lVar8 = lVar3;
      if (lVar8 == 0x10) goto LAB_00355d8e;
      bVar4 = isExtensionSupported
                        (this->m_ctxInfo,
                         *(char **)((long)createTexture::s_relaxingExtensions + lVar8));
      lVar3 = lVar8 + 8;
    } while (!bVar4);
    local_1b0._0_4_ = local_200.order;
    local_1b0._4_4_ = local_200.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    this_00 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,
                         (char **)((long)createTexture::s_relaxingExtensions + lVar8));
    std::operator<<((ostream *)&this_00->m_str," supported, assuming completeness test to pass.");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    (this->super_Tex2DCompletenessCase).m_compareColor.m_value = 0xffff0000;
  }
LAB_00355d8e:
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void Incomplete2DSizeCase::createTexture (void)
{
	static const char* const s_relaxingExtensions[] =
	{
		"GL_OES_texture_npot",
		"GL_NV_texture_npot_2D_mipmap",
	};

	tcu::TextureFormat		fmt				= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel		levelData		(fmt);
	TestLog&				log				= m_testCtx.getLog();

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int	levelW = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.x() : de::max(1, m_size.x() >> levelNdx);
		int	levelH = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.y() : de::max(1, m_size.y() >> levelNdx);

		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");

	// If size not allowed in core, search for relaxing extensions
	if (!deIsPowerOfTwo32(m_size.x()) && !deIsPowerOfTwo32(m_size.y()))
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_relaxingExtensions); ++ndx)
		{
			if (isExtensionSupported(m_ctxInfo, s_relaxingExtensions[ndx]))
			{
				log << TestLog::Message << s_relaxingExtensions[ndx] << " supported, assuming completeness test to pass." << TestLog::EndMessage;
				m_compareColor = RGBA(0,0,255,255);
				break;
			}
		}
	}
}